

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.h
# Opt level: O1

void __thiscall
kj::_::HeapDisposer<kj::(anonymous_namespace)::DatagramPortImpl>::disposeImpl
          (HeapDisposer<kj::(anonymous_namespace)::DatagramPortImpl> *this,void *pointer)

{
  if (pointer != (void *)0x0) {
    UnixEventPort::FdObserver::~FdObserver((FdObserver *)((long)pointer + 0x28));
    anon_unknown_30::OwnedFileDescriptor::~OwnedFileDescriptor
              ((OwnedFileDescriptor *)((long)pointer + 8));
    operator_delete(pointer,0x80);
    return;
  }
  return;
}

Assistant:

virtual void disposeImpl(void* pointer) const override { delete reinterpret_cast<T*>(pointer); }